

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void encode_block_intra(int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,
                       TX_SIZE tx_size,void *arg)

{
  long lVar1;
  long lVar2;
  PLANE_TYPE PVar3;
  int iVar4;
  AV1_COMMON *cm_00;
  AV1_COMMON *cm_01;
  MACROBLOCKD *xd_00;
  long lVar5;
  short *psVar6;
  byte bVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int in_R8D;
  TX_SIZE in_R9B;
  long *in_stack_00000008;
  TXB_CTX txb_ctx;
  _Bool do_dropout;
  _Bool do_trellis;
  int quant_idx;
  int use_trellis;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  int bw;
  TX_TYPE tx_type;
  int dummy_rate_cost;
  uint8_t *dst;
  int dst_stride;
  uint16_t *eob;
  PLANE_TYPE plane_type;
  tran_low_t *dqcoeff;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  encode_b_args *args;
  QUANT_PARAM *in_stack_fffffffffffffed8;
  TXB_CTX *txb_ctx_00;
  undefined8 in_stack_fffffffffffffee0;
  ENTROPY_CONTEXT *l_00;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef4;
  TX_SIZE in_stack_fffffffffffffef6;
  BLOCK_SIZE in_stack_fffffffffffffef7;
  undefined1 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffef9;
  undefined1 in_stack_fffffffffffffefa;
  TX_SIZE in_stack_fffffffffffffefb;
  undefined2 uVar8;
  TX_SIZE tx_size_00;
  undefined4 uVar9;
  PLANE_TYPE plane_type_00;
  int iVar10;
  undefined4 in_stack_ffffffffffffff0c;
  undefined6 in_stack_ffffffffffffff10;
  BLOCK_SIZE in_stack_ffffffffffffff16;
  byte in_stack_ffffffffffffff17;
  uint in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined2 in_stack_ffffffffffffff24;
  TX_TYPE in_stack_ffffffffffffff26;
  TX_SIZE in_stack_ffffffffffffff27;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  int in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  BLOCK_SIZE in_stack_ffffffffffffff4b;
  int in_stack_ffffffffffffff4c;
  MACROBLOCK *in_stack_ffffffffffffff50;
  int *in_stack_ffffffffffffff58;
  TX_SIZE in_stack_ffffffffffffff9b;
  undefined4 in_stack_ffffffffffffff9c;
  
  uVar8 = (undefined2)in_ECX;
  tx_size_00 = (TX_SIZE)((uint)in_ECX >> 0x10);
  uVar9 = CONCAT31((int3)in_EDX,(char)((uint)in_ECX >> 0x18));
  plane_type_00 = (PLANE_TYPE)((uint)in_EDX >> 0x18);
  bVar7 = (byte)in_R8D;
  cm_00 = (AV1_COMMON *)(*in_stack_00000008 + 0x3bf80);
  lVar1 = in_stack_00000008[1];
  lVar2 = **(long **)(lVar1 + 0x2058);
  cm_01 = (AV1_COMMON *)(lVar1 + (long)in_EDI * 0x88);
  xd_00 = (MACROBLOCKD *)(lVar1 + 0x1b0 + (long)in_EDI * 0xa30);
  lVar5 = *(long *)&(cm_01->current_frame).display_order_hint + (long)(in_ESI << 4) * 4;
  iVar10 = in_ESI;
  PVar3 = get_plane_type(in_EDI);
  psVar6 = (short *)(*(long *)&(cm_01->current_frame).skip_mode_info.ref_frame_idx_1 +
                    (long)in_ESI * 2);
  av1_predict_intra_block_facade
            (cm_01,xd_00,(int)((ulong)lVar5 >> 0x20),(int)lVar5,
             CONCAT13(PVar3,(int3)in_stack_ffffffffffffff9c),in_stack_ffffffffffffff9b);
  if ((in_EDI == 0) &&
     (iVar4 = is_blk_skip((uint8_t *)(lVar1 + 0x24e09),0,
                          in_EDX * (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                         [bVar7] + in_ECX), iVar4 != 0)) {
    *psVar6 = 0;
    *(undefined1 *)(*(long *)&(cm_01->current_frame).frame_refs_short_signaling + (long)in_ESI) = 0;
  }
  else {
    av1_subtract_txb(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff4b,
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                     (TX_SIZE)((uint)in_stack_ffffffffffffff3c >> 0x18));
    av1_get_tx_type((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffff0c,iVar10),plane_type_00,
                    CONCAT13((char)uVar9,CONCAT12(tx_size_00,uVar8)),in_R8D,
                    in_stack_fffffffffffffefb,
                    CONCAT13(in_stack_fffffffffffffef7,
                             CONCAT12(in_stack_fffffffffffffef6,in_stack_fffffffffffffef4)));
    in_stack_ffffffffffffff1c =
         is_trellis_used(*(TRELLIS_OPT_TYPE *)((long)in_stack_00000008 + 0x29),
                         (RUN_TYPE)in_stack_00000008[5]);
    in_stack_ffffffffffffff18 = (uint)(in_stack_ffffffffffffff1c == 0);
    av1_setup_xform((AV1_COMMON *)CONCAT17(plane_type_00,CONCAT43(uVar9,CONCAT12(tx_size_00,uVar8)))
                    ,(MACROBLOCK *)
                     CONCAT44(in_R8D,CONCAT13(in_stack_fffffffffffffefb,
                                              CONCAT12(in_stack_fffffffffffffefa,
                                                       CONCAT11(in_stack_fffffffffffffef9,
                                                                in_stack_fffffffffffffef8)))),
                    in_stack_fffffffffffffef7,in_stack_fffffffffffffef6,
                    (TxfmParam *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    av1_setup_quant((TX_SIZE)((ulong)in_stack_fffffffffffffee0 >> 0x38),
                    (int)in_stack_fffffffffffffee0,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                    (int)in_stack_fffffffffffffed8,(QUANT_PARAM *)0x2298f5);
    av1_setup_qmatrix((CommonQuantParams *)
                      CONCAT17(in_stack_fffffffffffffef7,
                               CONCAT16(in_stack_fffffffffffffef6,
                                        CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0
                                                ))),
                      (MACROBLOCKD *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                      (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                      (TX_SIZE)((ulong)in_stack_fffffffffffffee0 >> 0x18),
                      (TX_TYPE)((ulong)in_stack_fffffffffffffee0 >> 0x10),in_stack_fffffffffffffed8)
    ;
    txb_ctx_00 = (TXB_CTX *)&stack0xffffffffffffff48;
    l_00 = &stack0xffffffffffffff20;
    av1_xform_quant((MACROBLOCK *)
                    CONCAT17(in_stack_fffffffffffffef7,
                             CONCAT16(in_stack_fffffffffffffef6,
                                      CONCAT24(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0))
                            ),in_stack_fffffffffffffeec,in_stack_fffffffffffffee8,
                    (int)((ulong)l_00 >> 0x20),(int)l_00,(BLOCK_SIZE)((ulong)txb_ctx_00 >> 0x38),
                    (TxfmParam *)CONCAT17(plane_type_00,CONCAT43(uVar9,CONCAT12(tx_size_00,uVar8))),
                    (QUANT_PARAM *)CONCAT44(in_stack_ffffffffffffff0c,iVar10));
    iVar4 = frame_is_intra_only(cm_00);
    in_stack_fffffffffffffefb = true;
    if (iVar4 == 0) {
      iVar4 = frame_is_intra_only(cm_00);
      in_stack_fffffffffffffefa = iVar4 == 0;
      in_stack_fffffffffffffefb = in_stack_fffffffffffffefa;
    }
    in_stack_ffffffffffffff17 = in_stack_fffffffffffffefb;
    iVar4 = frame_is_intra_only(cm_00);
    in_stack_fffffffffffffef9 = true;
    if (iVar4 == 0) {
      iVar4 = frame_is_intra_only(cm_00);
      in_stack_fffffffffffffef8 = iVar4 == 0;
      in_stack_fffffffffffffef9 = in_stack_fffffffffffffef8;
    }
    in_stack_ffffffffffffff16 = in_stack_fffffffffffffef9;
    if ((in_stack_ffffffffffffff3c != 0) && ((in_stack_ffffffffffffff17 & 1) != 0)) {
      get_txb_ctx(in_stack_fffffffffffffef7,in_stack_fffffffffffffef6,in_stack_fffffffffffffef0,
                  (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                  l_00,txb_ctx_00);
      av1_optimize_b((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,in_stack_ffffffffffffff27,
                     in_stack_ffffffffffffff26,(TXB_CTX *)in_stack_ffffffffffffff50,
                     in_stack_ffffffffffffff58);
    }
    if ((in_stack_ffffffffffffff16 & BLOCK_4X8) != BLOCK_4X4) {
      av1_dropout_qcoeff((MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                         ,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28,
                         in_stack_ffffffffffffff27,in_stack_ffffffffffffff26,
                         in_stack_ffffffffffffff20);
    }
  }
  if (*psVar6 != 0) {
    av1_inverse_transform_block
              ((MACROBLOCKD *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)),
               (tran_low_t *)CONCAT44(in_stack_ffffffffffffff0c,iVar10),
               CONCAT13(plane_type_00,(int3)((uint)uVar9 >> 8)),(TX_TYPE)uVar9,tx_size_00,
               (uint8_t *)
               CONCAT44(in_R8D,CONCAT13(in_stack_fffffffffffffefb,
                                        CONCAT12(in_stack_fffffffffffffefa,
                                                 CONCAT11(in_stack_fffffffffffffef9,
                                                          in_stack_fffffffffffffef8)))),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,in_stack_ffffffffffffff30);
  }
  if ((*psVar6 == 0) && (in_EDI == 0)) {
    update_txk_array((MACROBLOCKD *)(lVar1 + 0x1a0),in_EDX,in_ECX,in_R9B,'\0');
  }
  *(undefined1 *)(lVar2 + 0x90) = 0;
  if ((in_EDI == 0) && (*(int *)(lVar1 + 0x3c50) != 0)) {
    cfl_store_tx((MACROBLOCKD *)
                 CONCAT17(in_stack_ffffffffffffff27,
                          CONCAT16(in_stack_ffffffffffffff26,
                                   CONCAT24(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20))),
                 in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff17,
                 in_stack_ffffffffffffff16);
  }
  return;
}

Assistant:

static void encode_block_intra(int plane, int block, int blk_row, int blk_col,
                               BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                               void *arg) {
  struct encode_b_args *const args = arg;
  const AV1_COMP *const cpi = args->cpi;
  const AV1_COMMON *const cm = &cpi->common;
  MACROBLOCK *const x = args->x;
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  struct macroblock_plane *const p = &x->plane[plane];
  struct macroblockd_plane *const pd = &xd->plane[plane];
  tran_low_t *dqcoeff = p->dqcoeff + BLOCK_OFFSET(block);
  PLANE_TYPE plane_type = get_plane_type(plane);
  uint16_t *eob = &p->eobs[block];
  const int dst_stride = pd->dst.stride;
  uint8_t *dst = &pd->dst.buf[(blk_row * dst_stride + blk_col) << MI_SIZE_LOG2];
  int dummy_rate_cost = 0;

  av1_predict_intra_block_facade(cm, xd, plane, blk_col, blk_row, tx_size);

  TX_TYPE tx_type = DCT_DCT;
  const int bw = mi_size_wide[plane_bsize];
  if (plane == 0 && is_blk_skip(x->txfm_search_info.blk_skip, plane,
                                blk_row * bw + blk_col)) {
    *eob = 0;
    p->txb_entropy_ctx[block] = 0;
  } else {
    av1_subtract_txb(x, plane, plane_bsize, blk_col, blk_row, tx_size);

    const ENTROPY_CONTEXT *a = &args->ta[blk_col];
    const ENTROPY_CONTEXT *l = &args->tl[blk_row];
    tx_type = av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                              cm->features.reduced_tx_set_used);
    TxfmParam txfm_param;
    QUANT_PARAM quant_param;
    const int use_trellis =
        is_trellis_used(args->enable_optimize_b, args->dry_run);
    int quant_idx;
    if (use_trellis)
      quant_idx = AV1_XFORM_QUANT_FP;
    else
      quant_idx =
          USE_B_QUANT_NO_TRELLIS ? AV1_XFORM_QUANT_B : AV1_XFORM_QUANT_FP;

    av1_setup_xform(cm, x, tx_size, tx_type, &txfm_param);
    av1_setup_quant(tx_size, use_trellis, quant_idx,
                    cpi->oxcf.q_cfg.quant_b_adapt, &quant_param);
    av1_setup_qmatrix(&cm->quant_params, xd, plane, tx_size, tx_type,
                      &quant_param);

    av1_xform_quant(x, plane, block, blk_row, blk_col, plane_bsize, &txfm_param,
                    &quant_param);

    // Whether trellis or dropout optimization is required for key frames and
    // intra frames.
    const bool do_trellis = (frame_is_intra_only(cm) &&
                             (KEY_BLOCK_OPT_TYPE == TRELLIS_OPT ||
                              KEY_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT)) ||
                            (!frame_is_intra_only(cm) &&
                             (INTRA_BLOCK_OPT_TYPE == TRELLIS_OPT ||
                              INTRA_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT));
    const bool do_dropout = (frame_is_intra_only(cm) &&
                             (KEY_BLOCK_OPT_TYPE == DROPOUT_OPT ||
                              KEY_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT)) ||
                            (!frame_is_intra_only(cm) &&
                             (INTRA_BLOCK_OPT_TYPE == DROPOUT_OPT ||
                              INTRA_BLOCK_OPT_TYPE == TRELLIS_DROPOUT_OPT));

    if (quant_param.use_optimize_b && do_trellis) {
      TXB_CTX txb_ctx;
      get_txb_ctx(plane_bsize, tx_size, plane, a, l, &txb_ctx);
      av1_optimize_b(args->cpi, x, plane, block, tx_size, tx_type, &txb_ctx,
                     &dummy_rate_cost);
    }
    if (do_dropout) {
      av1_dropout_qcoeff(x, plane, block, tx_size, tx_type,
                         cm->quant_params.base_qindex);
    }
  }

  if (*eob) {
    av1_inverse_transform_block(xd, dqcoeff, plane, tx_type, tx_size, dst,
                                dst_stride, *eob,
                                cm->features.reduced_tx_set_used);
  }

  // TODO(jingning): Temporarily disable txk_type check for eob=0 case.
  // It is possible that certain collision in hash index would cause
  // the assertion failure. To further optimize the rate-distortion
  // performance, we need to re-visit this part and enable this assert
  // again.
  if (*eob == 0 && plane == 0) {
#if 0
    if (args->cpi->oxcf.q_cfg.aq_mode == NO_AQ
        && args->cpi->oxcf.q_cfg.deltaq_mode == NO_DELTA_Q) {
      assert(xd->tx_type_map[blk_row * xd->tx_type_map_stride + blk_col)] ==
          DCT_DCT);
    }
#endif
    update_txk_array(xd, blk_row, blk_col, tx_size, DCT_DCT);
  }

  // For intra mode, skipped blocks are so rare that transmitting
  // skip_txfm = 1 is very expensive.
  mbmi->skip_txfm = 0;

#if !CONFIG_REALTIME_ONLY
  if (plane == AOM_PLANE_Y && xd->cfl.store_y) {
    cfl_store_tx(xd, blk_row, blk_col, tx_size, plane_bsize);
  }
#endif
}